

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O3

void pnga_sprs_array_diag_left_multiply(Integer s_a,Integer g_d)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  Integer grp;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  Integer iproc;
  void *buf;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  undefined1 (*pauVar15) [16];
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  int64_t *ilptr;
  int *iptr;
  void *vptr;
  Integer one;
  int64_t *jlptr;
  int *jptr;
  Integer khi;
  Integer klo;
  Integer jhi;
  Integer jlo;
  Integer ihi;
  Integer ilo;
  long local_b8;
  long local_b0;
  long local_a8;
  int local_9c;
  Integer local_98;
  Integer local_90;
  Integer local_88;
  ulong local_80;
  Integer local_78 [3];
  long local_60;
  long local_58;
  Integer local_50;
  Integer local_48;
  long local_40;
  long local_38;
  
  lVar19 = s_a + 1000;
  lVar18 = g_d + 1000;
  grp = SPA[lVar19].grp;
  local_88 = g_d;
  iproc = pnga_pgroup_nodeid(grp);
  local_98 = pnga_pgroup_nnodes(grp);
  lVar11 = SPA[lVar19].type;
  local_80 = (ulong)(uint)SPA[lVar19].idx_size;
  local_b0 = 0;
  local_78[2] = 0;
  local_b8 = 0;
  local_78[1] = 0;
  local_78[0] = 1;
  bVar20 = _ga_sync_begin != 0;
  local_9c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar20) {
    pnga_pgroup_sync(grp);
  }
  local_90 = grp;
  if (SPA[lVar19].idim != GA[lVar18].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) dimensions don\'t match",0);
  }
  if (lVar11 != GA[lVar18].type) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) data types don\'t match",0);
  }
  if (GA[lVar18].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) vector not of dimension 1",0);
  }
  pnga_sprs_array_row_distribution(s_a,iproc,&local_38,&local_40);
  buf = malloc(((local_40 + 1) - local_38) * SPA[lVar19].size);
  local_58 = local_38 + 1;
  local_60 = local_40 + 1;
  pnga_get(local_88,&local_58,&local_60,buf,local_78);
  if (0 < local_98) {
    lVar19 = 0;
    lVar11 = lVar11 + -0x3e9;
    do {
      pnga_sprs_array_column_distribution(s_a,lVar19,&local_48,&local_50);
      if ((int)local_80 == 4) {
        pnga_sprs_array_access_col_block(s_a,lVar19,&local_b0,local_78 + 2,&local_a8);
        if (local_a8 != 0) {
          switch(lVar11) {
          case 0:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar14 = lVar18 - local_38;
                lVar12 = (long)*(int *)(local_b0 + ((lVar18 + 1) - local_38) * 4) -
                         (long)*(int *)(local_b0 + lVar14 * 4);
                lVar16 = local_a8;
                if (0 < (int)lVar12) {
                  do {
                    lVar17 = (long)*(int *)(local_b0 + lVar14 * 4);
                    *(int *)(lVar16 + lVar17 * 4) =
                         *(int *)(lVar16 + lVar17 * 4) * *(int *)((long)buf + lVar14 * 4);
                    lVar12 = lVar12 + -1;
                    lVar16 = lVar16 + 4;
                  } while (lVar12 != 0);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 1:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar6 = *(int *)(local_b0 + ((lVar18 + 1) - local_38) * 4);
                iVar7 = *(int *)(local_b0 + (lVar18 - local_38) * 4);
                lVar16 = (long)iVar7;
                if (iVar7 < iVar6) {
                  do {
                    *(long *)(local_a8 + lVar16 * 8) =
                         *(long *)(local_a8 + lVar16 * 8) *
                         *(long *)((long)buf + (lVar18 - local_38) * 8);
                    lVar16 = lVar16 + 1;
                  } while (iVar6 != lVar16);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 2:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar6 = *(int *)(local_b0 + ((lVar18 + 1) - local_38) * 4);
                iVar7 = *(int *)(local_b0 + (lVar18 - local_38) * 4);
                lVar16 = (long)iVar7;
                if (iVar7 < iVar6) {
                  do {
                    *(float *)(local_a8 + lVar16 * 4) =
                         *(float *)((long)buf + (lVar18 - local_38) * 4) *
                         *(float *)(local_a8 + lVar16 * 4);
                    lVar16 = lVar16 + 1;
                  } while (iVar6 != lVar16);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 3:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar6 = *(int *)(local_b0 + ((lVar18 + 1) - local_38) * 4);
                iVar7 = *(int *)(local_b0 + (lVar18 - local_38) * 4);
                lVar16 = (long)iVar7;
                if (iVar7 < iVar6) {
                  do {
                    *(double *)(local_a8 + lVar16 * 8) =
                         *(double *)((long)buf + (lVar18 - local_38) * 8) *
                         *(double *)(local_a8 + lVar16 * 8);
                    lVar16 = lVar16 + 1;
                  } while (iVar6 != lVar16);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 5:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar6 = *(int *)(local_b0 + ((lVar18 + 1) - local_38) * 4);
                lVar16 = lVar18 - local_38;
                iVar7 = *(int *)(local_b0 + lVar16 * 4);
                lVar12 = (long)iVar7;
                if (iVar7 < iVar6) {
                  do {
                    fVar1 = *(float *)((long)buf + (lVar16 * 2 + 1) * 4);
                    uVar5 = *(undefined8 *)(local_a8 + lVar12 * 8);
                    fVar2 = *(float *)((long)buf + lVar16 * 8);
                    fVar21 = (float)uVar5;
                    fVar22 = (float)((ulong)uVar5 >> 0x20);
                    *(ulong *)(local_a8 + lVar12 * 8) =
                         CONCAT44(fVar2 * fVar22 + fVar21 * fVar1,fVar2 * fVar21 + fVar22 * -fVar1);
                    lVar12 = lVar12 + 1;
                  } while (iVar6 != lVar12);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 6:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar12 = lVar18 - local_38;
                lVar14 = (long)*(int *)(local_b0 + lVar12 * 4);
                lVar16 = *(int *)(local_b0 + ((lVar18 + 1) - local_38) * 4) - lVar14;
                if (0 < (int)lVar16) {
                  pauVar15 = (undefined1 (*) [16])(lVar14 * 0x10 + local_a8);
                  do {
                    dVar3 = *(double *)((long)buf + (lVar12 * 2 + 1) * 8);
                    dVar4 = *(double *)((long)buf + lVar12 * 0x10);
                    dVar10 = dVar4 * *(double *)(*pauVar15 + 8) + *(double *)*pauVar15 * dVar3;
                    auVar8._8_4_ = SUB84(dVar10,0);
                    auVar8._0_8_ = dVar4 * *(double *)*pauVar15 +
                                   *(double *)(*pauVar15 + 8) * -dVar3;
                    auVar8._12_4_ = (int)((ulong)dVar10 >> 0x20);
                    *pauVar15 = auVar8;
                    pauVar15 = pauVar15 + 1;
                    lVar16 = lVar16 + -1;
                  } while (lVar16 != 0);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 0xf:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                iVar6 = *(int *)(local_b0 + ((lVar18 + 1) - local_38) * 4);
                iVar7 = *(int *)(local_b0 + (lVar18 - local_38) * 4);
                lVar16 = (long)iVar7;
                if (iVar7 < iVar6) {
                  do {
                    *(long *)(local_a8 + lVar16 * 8) =
                         *(long *)(local_a8 + lVar16 * 8) *
                         *(long *)((long)buf + (lVar18 - local_38) * 8);
                    lVar16 = lVar16 + 1;
                  } while (iVar6 != lVar16);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
          }
        }
      }
      else {
        pnga_sprs_array_access_col_block(s_a,lVar19,&local_b8,local_78 + 1,&local_a8);
        if (local_a8 != 0) {
          switch(lVar11) {
          case 0:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar16 = *(long *)(local_b8 + ((lVar18 + 1) - local_38) * 8);
                lVar12 = *(long *)(local_b8 + (lVar18 - local_38) * 8);
                if (lVar12 < lVar16) {
                  do {
                    *(int *)(local_a8 + lVar12 * 4) =
                         *(int *)(local_a8 + lVar12 * 4) *
                         *(int *)((long)buf + (lVar18 - local_38) * 4);
                    lVar12 = lVar12 + 1;
                  } while (lVar16 != lVar12);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 1:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar16 = *(long *)(local_b8 + ((lVar18 + 1) - local_38) * 8);
                lVar13 = lVar18 - local_38;
                lVar12 = *(long *)(local_b8 + lVar13 * 8);
                lVar17 = lVar16 - lVar12;
                lVar14 = local_a8;
                if (lVar17 != 0 && lVar12 <= lVar16) {
                  do {
                    lVar16 = *(long *)(local_b8 + lVar13 * 8);
                    *(long *)(lVar14 + lVar16 * 8) =
                         *(long *)(lVar14 + lVar16 * 8) * *(long *)((long)buf + lVar13 * 8);
                    lVar17 = lVar17 + -1;
                    lVar14 = lVar14 + 8;
                  } while (lVar17 != 0);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 2:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar16 = *(long *)(local_b8 + ((lVar18 + 1) - local_38) * 8);
                lVar12 = *(long *)(local_b8 + (lVar18 - local_38) * 8);
                if (lVar12 < lVar16) {
                  do {
                    *(float *)(local_a8 + lVar12 * 4) =
                         *(float *)((long)buf + (lVar18 - local_38) * 4) *
                         *(float *)(local_a8 + lVar12 * 4);
                    lVar12 = lVar12 + 1;
                  } while (lVar16 != lVar12);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 3:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar16 = *(long *)(local_b8 + ((lVar18 + 1) - local_38) * 8);
                lVar12 = *(long *)(local_b8 + (lVar18 - local_38) * 8);
                if (lVar12 < lVar16) {
                  do {
                    *(double *)(local_a8 + lVar12 * 8) =
                         *(double *)((long)buf + (lVar18 - local_38) * 8) *
                         *(double *)(local_a8 + lVar12 * 8);
                    lVar12 = lVar12 + 1;
                  } while (lVar16 != lVar12);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 5:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar16 = *(long *)(local_b8 + ((lVar18 + 1) - local_38) * 8);
                lVar14 = lVar18 - local_38;
                lVar12 = *(long *)(local_b8 + lVar14 * 8);
                if (lVar12 < lVar16) {
                  do {
                    fVar1 = *(float *)((long)buf + (lVar14 * 2 + 1) * 4);
                    uVar5 = *(undefined8 *)(local_a8 + lVar12 * 8);
                    fVar2 = *(float *)((long)buf + lVar14 * 8);
                    fVar21 = (float)uVar5;
                    fVar22 = (float)((ulong)uVar5 >> 0x20);
                    *(ulong *)(local_a8 + lVar12 * 8) =
                         CONCAT44(fVar2 * fVar22 + fVar21 * fVar1,fVar2 * fVar21 + fVar22 * -fVar1);
                    lVar12 = lVar12 + 1;
                  } while (lVar16 != lVar12);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 6:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar16 = *(long *)(local_b8 + ((lVar18 + 1) - local_38) * 8);
                lVar17 = lVar18 - local_38;
                lVar12 = *(long *)(local_b8 + lVar17 * 8);
                lVar14 = lVar16 - lVar12;
                if (lVar14 != 0 && lVar12 <= lVar16) {
                  pauVar15 = (undefined1 (*) [16])(lVar12 * 0x10 + local_a8);
                  do {
                    dVar3 = *(double *)((long)buf + (lVar17 * 2 + 1) * 8);
                    dVar4 = *(double *)((long)buf + lVar17 * 0x10);
                    dVar10 = dVar4 * *(double *)(*pauVar15 + 8) + *(double *)*pauVar15 * dVar3;
                    auVar9._8_4_ = SUB84(dVar10,0);
                    auVar9._0_8_ = dVar4 * *(double *)*pauVar15 +
                                   *(double *)(*pauVar15 + 8) * -dVar3;
                    auVar9._12_4_ = (int)((ulong)dVar10 >> 0x20);
                    *pauVar15 = auVar9;
                    pauVar15 = pauVar15 + 1;
                    lVar14 = lVar14 + -1;
                  } while (lVar14 != 0);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
            break;
          case 0xf:
            lVar18 = local_38;
            if (local_38 <= local_40) {
              do {
                lVar16 = *(long *)(local_b8 + ((lVar18 + 1) - local_38) * 8);
                lVar12 = *(long *)(local_b8 + (lVar18 - local_38) * 8);
                if (lVar12 < lVar16) {
                  do {
                    *(long *)(local_a8 + lVar12 * 8) =
                         *(long *)(local_a8 + lVar12 * 8) *
                         *(long *)((long)buf + (lVar18 - local_38) * 8);
                    lVar12 = lVar12 + 1;
                  } while (lVar16 != lVar12);
                }
                bVar20 = lVar18 != local_40;
                lVar18 = lVar18 + 1;
              } while (bVar20);
            }
          }
        }
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != local_98);
  }
  free(buf);
  if (local_9c != 0) {
    pnga_pgroup_sync(local_90);
  }
  return;
}

Assistant:

void pnga_sprs_array_diag_left_multiply(Integer s_a, Integer g_d)
{
  Integer hdl = GA_OFFSET + s_a;
  Integer d_hdl = GA_OFFSET + g_d;
  int local_sync_begin,local_sync_end;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer ilo, ihi, jlo, jhi, klo, khi;
  Integer i, j, iproc, ncols;
  Integer type = SPA[hdl].type;
  int idx_size = SPA[hdl].idx_size;
  int *iptr = NULL, *jptr = NULL;
  int64_t *ilptr = NULL, *jlptr = NULL;
  Integer one = 1;
  void *vbuf;
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* check for basic compatibility */
  if (SPA[hdl].idim != GA[d_hdl].dims[0]) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) dimensions don't match",0);
  }
  if (type != GA[d_hdl].type) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) data types don't match",0);
  }
  if (GA[d_hdl].ndim != 1) {
    pnga_error("(pnga_sprs_array_diag_left_multiply) vector not of dimension 1",0);
  }

#define SPRS_REAL_LEFT_MULTIPLY_M(_type,_iptr)                        \
  {                                                                   \
    _type *_buf = (_type*)vbuf;                                       \
    _type *_ptr = (_type*)vptr;                                       \
    for (i=ilo; i<=ihi; i++) {                                        \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                            \
      for (j=0; j<ncols; j++) {                                       \
        _ptr[_iptr[i-ilo]+j] = _buf[i-ilo]*_ptr[_iptr[i-ilo]+j];      \
      }                                                               \
    }                                                                 \
  }

#define SPRS_COMPLEX_LEFT_MULTIPLY_M(_type,_iptr)                     \
  {                                                                   \
    _type *_buf = (_type*)vbuf;                                       \
    _type *_ptr = (_type*)vptr;                                       \
    _type rbuf, ibuf, rval, ival;                                     \
    for (i=ilo; i<=ihi; i++) {                                        \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                            \
      for (j=0; j<ncols; j++) {                                       \
        rbuf = _buf[2*(i-ilo)];                                       \
        ibuf = _buf[2*(i-ilo)+1];                                     \
        rval = _ptr[2*(_iptr[i-ilo]+j)];                              \
        ival = _ptr[2*(_iptr[i-ilo]+j)+1];                            \
        _ptr[2*(_iptr[i-ilo]+j)] = rbuf*rval-ibuf*ival;               \
        _ptr[2*(_iptr[i-ilo]+j)+1] = rbuf*ival+ibuf*rval;             \
      }                                                               \
    }                                                                 \
  }

  /* get block from diagonal array corresponding to this row block (there is
   * only one) */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  vbuf = malloc((ihi-ilo+1)*SPA[hdl].size);
  klo = ilo+1;
  khi = ihi+1;
  pnga_get(g_d,&klo,&khi,vbuf,&one);
  /* loop over blocks in sparse array */
  for (iproc=0; iproc<nproc; iproc++) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_LEFT_MULTIPLY_M(int,iptr);
        } else if (type == C_LONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long,iptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long long,iptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_LEFT_MULTIPLY_M(float,iptr);
        } else if (type == C_DBL) {
          SPRS_REAL_LEFT_MULTIPLY_M(double,iptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(float,iptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(double,iptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_LEFT_MULTIPLY_M(int,ilptr);
        } else if (type == C_LONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long,ilptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_LEFT_MULTIPLY_M(long long,ilptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_LEFT_MULTIPLY_M(float,ilptr);
        } else if (type == C_DBL) {
          SPRS_REAL_LEFT_MULTIPLY_M(double,ilptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(float,ilptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_LEFT_MULTIPLY_M(double,ilptr);
        }
      }
    }
  }
  free(vbuf);

#undef SPRS_REAL_LEFT_MULTIPLY
#undef SPRS_COMPLEX_LEFT_MULTIPLY

  if (local_sync_end) pnga_pgroup_sync(grp);
}